

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O3

void __thiscall SDLFB::~SDLFB(SDLFB *this)

{
  SDL_Renderer *pSVar1;
  
  (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_008633b0;
  pSVar1 = this->Renderer;
  if (pSVar1 != (SDL_Renderer *)0x0) {
    if ((this->field_8).Texture != (SDL_Texture *)0x0) {
      SDL_DestroyTexture((this->field_8).Texture);
      pSVar1 = this->Renderer;
    }
    SDL_DestroyRenderer(pSVar1);
  }
  if (this->Screen != (SDL_Window *)0x0) {
    SDL_DestroyWindow();
  }
  DSimpleCanvas::~DSimpleCanvas((DSimpleCanvas *)this);
  return;
}

Assistant:

SDLFB::~SDLFB ()
{
	if (Renderer)
	{
		if (Texture)
			SDL_DestroyTexture (Texture);
		SDL_DestroyRenderer (Renderer);
	}

	if(Screen)
	{
		SDL_DestroyWindow (Screen);
	}
}